

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void addfield(lua_State *L,luaL_Buffer *b,int i)

{
  Node *pNVar1;
  int iVar2;
  char *pcVar3;
  
  lua_rawgeti(L,1,i);
  pNVar1 = (Node *)L->top;
  iVar2 = -1;
  if (pNVar1 != &dummynode_) {
    if (0xfffffffd < *(int *)((long)&pNVar1[-1].i_key + 0x10) - 5U) {
      luaL_addvalue(b);
      return;
    }
    if (pNVar1 != &dummynode_) {
      iVar2 = *(int *)((long)&pNVar1[-1].i_key + 0x10);
    }
  }
  if (iVar2 == -1) {
    pcVar3 = "no value";
  }
  else {
    pcVar3 = luaT_typenames[iVar2];
  }
  luaL_error(L,"invalid value (%s) at index %d in table for \'concat\'",pcVar3,(ulong)(uint)i);
}

Assistant:

static void addfield(lua_State*L,luaL_Buffer*b,int i){
lua_rawgeti(L,1,i);
if(!lua_isstring(L,-1))
luaL_error(L,"invalid value (%s) at index %d in table for "
LUA_QL("concat"),luaL_typename(L,-1),i);
luaL_addvalue(b);
}